

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexOrdering.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderVertexOrdering::verifyVertexOrderingDoesNotChangeGeneratedPoints
          (TessellationShaderVertexOrdering *this,_test_iteration *test_iteration_a,
          _test_iteration *test_iteration_b)

{
  ostringstream *this_00;
  char *pcVar1;
  char *pcVar2;
  MessageBuilder *pMVar3;
  TestError *this_01;
  _tessellation_shader_vertex_ordering vertex_ordering_00;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint n_vertex_b;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  string primitive_mode;
  string vertex_ordering;
  undefined1 local_198 [384];
  
  pcVar1 = test_iteration_a->data;
  pcVar2 = test_iteration_b->data;
  uVar4 = 0;
LAB_00cb35a7:
  if (test_iteration_a->n_vertices <= uVar4) {
    return;
  }
  uVar5 = (ulong)(uint)((int)uVar4 * 3);
  uVar6 = 0;
  uVar7 = 0;
  do {
    if (test_iteration_b->n_vertices <= uVar7) {
      TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
                (&primitive_mode,(TessellationShaderUtils *)(ulong)test_iteration_a->primitive_mode,
                 (_tessellation_primitive_mode)pcVar2);
      TessellationShaderUtils::getESTokenForVertexOrderingMode_abi_cxx11_
                (&vertex_ordering,
                 (TessellationShaderUtils *)(ulong)test_iteration_a->vertex_ordering,
                 vertex_ordering_00);
      local_198._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_198 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"For primitive mode: [");
      std::operator<<((ostream *)this_00,primitive_mode._M_dataplus._M_p);
      std::operator<<((ostream *)this_00,"] and inner tessellation levels: [");
      pMVar3 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_198,test_iteration_a->inner_tess_levels);
      std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,test_iteration_a->inner_tess_levels + 1);
      std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      "] and outer tessellation levels: [");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,test_iteration_a->outer_tess_levels);
      std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,test_iteration_a->outer_tess_levels + 1);
      std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,test_iteration_a->outer_tess_levels + 2);
      std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,test_iteration_a->outer_tess_levels + 3);
      std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"] ");
      std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      ", vertices generated for CW and CCW orientations do not match.");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,
                 "For runs in which only vertex ordering setting differs, vertex from one run was not found in the other run."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexOrdering.cpp"
                 ,0x2db);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    uVar8 = (ulong)uVar6;
    fVar9 = *(float *)(pcVar1 + uVar5 * 4) - *(float *)(pcVar2 + uVar8 * 4);
    fVar10 = -fVar9;
    if (-fVar9 <= fVar9) {
      fVar10 = fVar9;
    }
    if (fVar10 < 1e-05) {
      fVar9 = *(float *)(pcVar1 + uVar5 * 4 + 4) - *(float *)(pcVar2 + uVar8 * 4 + 4);
      fVar10 = -fVar9;
      if (-fVar9 <= fVar9) {
        fVar10 = fVar9;
      }
      if (fVar10 < 1e-05) {
        fVar9 = *(float *)(pcVar1 + uVar5 * 4 + 8) - *(float *)(pcVar2 + uVar8 * 4 + 8);
        fVar10 = -fVar9;
        if (-fVar9 <= fVar9) {
          fVar10 = fVar9;
        }
        if (fVar10 < 1e-05) break;
      }
    }
    uVar7 = uVar7 + 1;
    uVar6 = uVar6 + 3;
  } while( true );
  uVar4 = uVar4 + 1;
  goto LAB_00cb35a7;
}

Assistant:

void TessellationShaderVertexOrdering::verifyVertexOrderingDoesNotChangeGeneratedPoints(
	const _test_iteration& test_iteration_a, const _test_iteration& test_iteration_b)
{
	const float epsilon = 1e-5f;

	/* Sanity checks */
	DE_ASSERT(test_iteration_a.is_point_mode_enabled);
	DE_ASSERT(test_iteration_b.is_point_mode_enabled);
	DE_ASSERT(test_iteration_a.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_CCW ||
			  test_iteration_a.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT);
	DE_ASSERT(test_iteration_b.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_CW);

	/* Iterate through all points in test set A and make sure they can be found in test set B */
	for (unsigned int n_vertex_a = 0; n_vertex_a < test_iteration_a.n_vertices; ++n_vertex_a)
	{
		bool		 has_been_found = false;
		const float* vertex_a_data  = (const float*)test_iteration_a.data + n_vertex_a * 3 /* components */;

		for (unsigned int n_vertex_b = 0; n_vertex_b < test_iteration_b.n_vertices; ++n_vertex_b)
		{
			const float* vertex_b_data = (const float*)test_iteration_b.data + n_vertex_b * 3 /* components */;

			if (de::abs(vertex_a_data[0] - vertex_b_data[0]) < epsilon &&
				de::abs(vertex_a_data[1] - vertex_b_data[1]) < epsilon &&
				de::abs(vertex_a_data[2] - vertex_b_data[2]) < epsilon)
			{
				has_been_found = true;

				break;
			}
		} /* for (all B set vertices) */

		if (!has_been_found)
		{
			std::string primitive_mode =
				TessellationShaderUtils::getESTokenForPrimitiveMode(test_iteration_a.primitive_mode);
			std::string vertex_ordering =
				TessellationShaderUtils::getESTokenForVertexOrderingMode(test_iteration_a.vertex_ordering);

			m_testCtx.getLog() << tcu::TestLog::Message << "For primitive mode: [" << primitive_mode.c_str()
							   << "] "
								  "and inner tessellation levels:"
								  " ["
							   << test_iteration_a.inner_tess_levels[0] << ", " << test_iteration_a.inner_tess_levels[1]
							   << "] "
								  "and outer tessellation levels:"
								  " ["
							   << test_iteration_a.outer_tess_levels[0] << ", " << test_iteration_a.outer_tess_levels[1]
							   << ", " << test_iteration_a.outer_tess_levels[2] << ", "
							   << test_iteration_a.outer_tess_levels[3] << "] "
							   << ", vertices generated for CW and CCW orientations do not match."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("For runs in which only vertex ordering setting differs, vertex from one run was not found in the "
					 "other run.");
		}
	} /* for (all A set vertices) */
}